

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int idaLsFreeB(IDABMem IDAB_mem)

{
  if (IDAB_mem != (IDABMem)0x0) {
    free(IDAB_mem->ida_lmem);
  }
  return 0;
}

Assistant:

int idaLsFreeB(IDABMem IDAB_mem)
{
  IDALsMemB idalsB_mem;

  /* Return immediately if IDAB_mem or IDAB_mem->ida_lmem are NULL */
  if (IDAB_mem == NULL) { return (IDALS_SUCCESS); }
  if (IDAB_mem->ida_lmem == NULL) { return (IDALS_SUCCESS); }
  idalsB_mem = (IDALsMemB)IDAB_mem->ida_lmem;

  /* free IDALsMemB interface structure */
  free(idalsB_mem);

  return (IDALS_SUCCESS);
}